

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O3

int read_features_json<true>(vw *all,v_array<example_*> *examples)

{
  uint64_t *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  parser *ppVar3;
  char *line_00;
  bool bVar4;
  size_t sVar5;
  example *ae;
  bool bVar6;
  substring example;
  char *line;
  size_t num_chars;
  example *local_90;
  DecisionServiceInteraction interaction;
  
  sVar5 = read_features(all,&line,&num_chars);
  if (sVar5 != 0) {
    paVar2 = &interaction.eventId.field_2;
    do {
      *(undefined1 *)(CONCAT71(line._1_7_,line._0_1_) + num_chars) = 0;
      line_00 = (char *)CONCAT71(line._1_7_,line._0_1_);
      if (all->p->decision_service_json != true) {
        VW::read_line_json<true>(all,examples,line_00,VW::get_unused_example,all);
LAB_001e7303:
        if ((ulong)((long)examples->_end - (long)examples->_begin) < 9) {
          return 1;
        }
        ppVar3 = all->p;
        ae = VW::object_pool<example,_example_initializer>::get_object(&ppVar3->example_pool);
        ae->in_use = true;
        puVar1 = &ppVar3->begin_parsed_examples;
        *puVar1 = *puVar1 + 1;
        line._0_1_ = 0;
        example.end = (char *)&line;
        example.begin = (char *)&line;
        substring_to_example(all,ae,example);
        interaction.eventId._M_dataplus._M_p = (pointer)ae;
        v_array<example_*>::push_back(examples,(example **)&interaction);
        return 1;
      }
      if (*line_00 == '{') {
        interaction.eventId._M_string_length = 0;
        interaction.eventId.field_2._M_local_buf[0] = '\0';
        interaction.probabilityOfDrop = 0.0;
        interaction.skipLearn = false;
        interaction.probabilities.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        interaction.probabilities.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_5_ = 0;
        interaction.probabilities.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._5_3_ = 0;
        interaction.actions.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        interaction.probabilities.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        interaction.actions.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        interaction.actions.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        interaction.eventId._M_dataplus._M_p = (pointer)paVar2;
        VW::read_line_decision_service_json<true>
                  (all,examples,line_00,num_chars,false,VW::get_unused_example,all,&interaction);
        bVar4 = interaction.skipLearn;
        if (interaction.skipLearn == true) {
          VW::return_multiple_example(all,examples);
          ppVar3 = all->p;
          local_90 = VW::object_pool<example,_example_initializer>::get_object
                               (&ppVar3->example_pool);
          local_90->in_use = true;
          puVar1 = &ppVar3->begin_parsed_examples;
          *puVar1 = *puVar1 + 1;
          v_array<example_*>::push_back(examples,&local_90);
        }
        bVar6 = interaction.actions.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish !=
                interaction.actions.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start;
        if (interaction.probabilities.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(interaction.probabilities.
                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (interaction.actions.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(interaction.actions.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)interaction.eventId._M_dataplus._M_p != paVar2) {
          operator_delete(interaction.eventId._M_dataplus._M_p);
        }
        if (bVar6 && bVar4 == false) goto LAB_001e7303;
      }
      sVar5 = read_features(all,&line,&num_chars);
    } while (sVar5 != 0);
  }
  return 0;
}

Assistant:

int read_features_json(vw* all, v_array<example*>& examples)
{
  bool reread;
  do
  {
    reread = false;

    char* line;
    size_t num_chars;
    size_t num_chars_initial = read_features(all, line, num_chars);
    if (num_chars_initial < 1)
      return (int)num_chars_initial;

    line[num_chars] = '\0';
    if (all->p->decision_service_json)
    {
      // Skip lines that do not start with "{"
      if (line[0] != '{')
      {
        reread = true;
        continue;
      }

      DecisionServiceInteraction interaction;
      VW::template read_line_decision_service_json<audit>(*all, examples, line, num_chars, false,
          reinterpret_cast<VW::example_factory_t>(&VW::get_unused_example), all, &interaction);

      if (interaction.skipLearn)
      {
        VW::return_multiple_example(*all, examples);
        examples.push_back(&VW::get_unused_example(all));
        reread = true;
      }

      // let's continue reading data until we find a line with actions provided
      if (interaction.actions.size() == 0)
        reread = true;
    }
    else
      VW::template read_line_json<audit>(
          *all, examples, line, reinterpret_cast<VW::example_factory_t>(&VW::get_unused_example), all);
  } while (reread);

  // note: the json parser does single pass parsing and cannot determine if a shared example is needed.
  // since the communication between the parsing thread the main learner expects examples to be requested in order (as
  // they're layed out in memory) there is no way to determine upfront if a shared example exists thus even if there are
  // no features for the shared example, still an empty example is returned.

  if (examples.size() > 1)
  {  // insert new line example at the end
    example& ae = VW::get_unused_example(all);
    char empty = '\0';
    substring example = {&empty, &empty};
    substring_to_example(all, &ae, example);

    examples.push_back(&ae);
  }

  return 1;
}